

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O3

void __thiscall
RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
::populate(RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
           *this)

{
  pointer pbVar1;
  uint uVar2;
  result_type rVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  size_type __pos;
  size_t length;
  size_t sVar6;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  mt19937 randgen;
  param_type local_13e8;
  param_type local_13e0;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::_M_erase_at_end(&this->m_tokens,
                    (this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->m_str)._M_string_length = 0;
  *(this->m_str)._M_dataplus._M_p = '\0';
  uVar2 = std::chrono::_V2::system_clock::now();
  local_13b8._M_x[0] = (unsigned_long)uVar2;
  lVar5 = 1;
  uVar4 = local_13b8._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
    local_13b8._M_x[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_13b8._M_p = 0x270;
  local_13e0._M_a = 5;
  local_13e0._M_b = 0x40;
  local_13e8._M_a = 0;
  local_13e8._M_b = 0x10;
  sVar6 = this->m_fixed_word_count;
  if (sVar6 == 0) {
    rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_13e0,&local_13b8,&local_13e0
                      );
    sVar6 = (size_t)rVar3;
  }
  if ((ulong)((long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < sVar6) {
    do {
      length = this->m_fixed_word_length;
      if (length == 0) {
        rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_13e8,&local_13b8,
                           &local_13e8);
        length = (size_t)rVar3;
      }
      make_word<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
                (&local_13d8,length,
                 (this->m_delim)._M_dataplus._M_p[(this->m_delim)._M_string_length - 1]);
      std::
      vector<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::allocator<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
      ::
      emplace_back<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
                ((vector<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::allocator<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
                  *)&this->m_tokens,&local_13d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
           *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
        operator_delete(local_13d8._M_dataplus._M_p,local_13d8.field_2._M_allocated_capacity + 1);
      }
      pbVar1 = (this->m_tokens).
               super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::
      basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
      replace(&this->m_str,(this->m_str)._M_string_length,0,pbVar1[-1]._M_dataplus._M_p,
              pbVar1[-1]._M_string_length);
      uVar4 = (long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar4 < sVar6) {
        std::__cxx11::
        basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
        replace(&this->m_str,(this->m_str)._M_string_length,0,(this->m_delim)._M_dataplus._M_p,
                (this->m_delim)._M_string_length);
        uVar4 = (long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
    } while (uVar4 < sVar6);
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(word_length, m_delim.back()));
			m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			if (m_tokens.size() < word_count) {
				m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
			}
		}
	}